

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_2d_sse4.c
# Opt level: O3

void av1_highbd_dist_wtd_convolve_2d_copy_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               ConvolveParams *conv_params,int bd)

{
  int iVar1;
  uint16_t *puVar2;
  short sVar3;
  short sVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint16_t *puVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  uint16_t *puVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint16_t *puVar17;
  uint16_t *puVar18;
  uint uVar19;
  uint16_t *puVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  undefined1 auVar26 [16];
  short sVar27;
  int iVar28;
  int iVar33;
  int iVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar35;
  undefined1 auVar32 [16];
  short sVar36;
  int iVar37;
  int iVar44;
  int iVar45;
  undefined1 in_XMM9 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar46;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM11 [16];
  
  iVar6 = conv_params->round_0 + conv_params->round_1;
  cVar5 = (char)bd - (char)iVar6;
  uVar16 = 0xe - iVar6;
  auVar21 = ZEXT416(uVar16);
  uVar19 = (1 << (cVar5 + 0xdU & 0x1f)) + (1 << (cVar5 + 0xeU & 0x1f));
  uVar10 = 0xff;
  if (bd == 0xc) {
    uVar10 = 0xfff;
  }
  puVar2 = conv_params->dst;
  uVar7 = 0x3ff;
  if (bd != 10) {
    uVar7 = uVar10;
  }
  lVar11 = (long)conv_params->dst_stride;
  iVar6 = conv_params->do_average;
  iVar25 = conv_params->fwd_offset;
  iVar28 = conv_params->bck_offset;
  iVar1 = conv_params->use_dist_wtd_comp_avg;
  auVar22._4_4_ = iVar25;
  auVar22._0_4_ = iVar25;
  auVar22._8_4_ = iVar25;
  auVar22._12_4_ = iVar25;
  auVar23._4_4_ = iVar28;
  auVar23._0_4_ = iVar28;
  auVar23._8_4_ = iVar28;
  auVar23._12_4_ = iVar28;
  auVar24 = pshuflw(ZEXT416(uVar19),ZEXT416(uVar19),0);
  auVar24._4_4_ = auVar24._0_4_;
  auVar24._8_4_ = auVar24._0_4_;
  auVar24._12_4_ = auVar24._0_4_;
  iVar25 = (1 << ((byte)uVar16 & 0x1f)) >> 1;
  auVar26 = pshuflw(ZEXT416(uVar7),ZEXT416(uVar7),0);
  sVar3 = auVar26._0_2_;
  sVar4 = auVar26._2_2_;
  if ((w & 7U) == 0) {
    if (0 < h) {
      uVar8 = 0;
      puVar20 = puVar2;
      do {
        if (0 < w) {
          lVar12 = 0;
          do {
            auVar26 = psllw(*(undefined1 (*) [16])(src + lVar12),auVar21);
            if (iVar6 == 0) {
              in_XMM9 = paddusw(auVar26,auVar24);
              puVar9 = puVar2 + uVar8 * lVar11;
            }
            else {
              auVar30 = *(undefined1 (*) [16])(puVar20 + lVar12);
              in_XMM11 = pmovzxwd(in_XMM11,auVar30);
              auVar47._0_4_ = CONCAT22(0,auVar30._8_2_);
              auVar47._4_2_ = auVar30._10_2_;
              auVar47._6_2_ = 0;
              auVar47._8_2_ = auVar30._12_2_;
              auVar47._10_2_ = 0;
              auVar47._12_2_ = auVar30._14_2_;
              auVar47._14_2_ = 0;
              auVar42 = pmovzxwd(in_XMM9,auVar26);
              auVar43._0_4_ = auVar42._0_4_ + uVar19;
              auVar43._4_4_ = auVar42._4_4_ + uVar19;
              auVar43._8_4_ = auVar42._8_4_ + uVar19;
              auVar43._12_4_ = auVar42._12_4_ + uVar19;
              if (iVar1 == 0) {
                iVar37 = auVar43._0_4_ + in_XMM11._0_4_ >> 1;
                iVar44 = auVar43._4_4_ + in_XMM11._4_4_ >> 1;
                iVar45 = auVar43._8_4_ + in_XMM11._8_4_ >> 1;
                iVar46 = auVar43._12_4_ + in_XMM11._12_4_ >> 1;
                iVar28 = (int)(auVar47._0_4_ + uVar19 + (uint)auVar26._8_2_) >> 1;
                iVar33 = (int)(auVar30._10_2_ + uVar19 + (uint)auVar26._10_2_) >> 1;
                iVar34 = (int)(auVar30._12_2_ + uVar19 + (uint)auVar26._12_2_) >> 1;
                iVar35 = (int)(auVar30._14_2_ + uVar19 + (uint)auVar26._14_2_) >> 1;
              }
              else {
                in_XMM11 = pmulld(in_XMM11,auVar22);
                auVar30 = pmulld(auVar43,auVar23);
                iVar37 = auVar30._0_4_ + in_XMM11._0_4_ >> 4;
                iVar44 = auVar30._4_4_ + in_XMM11._4_4_ >> 4;
                iVar45 = auVar30._8_4_ + in_XMM11._8_4_ >> 4;
                iVar46 = auVar30._12_4_ + in_XMM11._12_4_ >> 4;
                auVar30._0_4_ = auVar26._8_2_ + uVar19;
                auVar30._4_4_ = auVar26._10_2_ + uVar19;
                auVar30._8_4_ = auVar26._12_2_ + uVar19;
                auVar30._12_4_ = auVar26._14_2_ + uVar19;
                auVar42 = pmulld(auVar47,auVar22);
                auVar26 = pmulld(auVar30,auVar23);
                iVar28 = auVar26._0_4_ + auVar42._0_4_ >> 4;
                iVar33 = auVar26._4_4_ + auVar42._4_4_ >> 4;
                iVar34 = auVar26._8_4_ + auVar42._8_4_ >> 4;
                iVar35 = auVar26._12_4_ + auVar42._12_4_ >> 4;
              }
              auVar42._0_4_ = (int)(iVar37 + (iVar25 - uVar19)) >> auVar21;
              auVar42._4_4_ = (int)(iVar44 + (iVar25 - uVar19)) >> auVar21;
              auVar42._8_4_ = (int)(iVar45 + (iVar25 - uVar19)) >> auVar21;
              auVar42._12_4_ = (int)(iVar46 + (iVar25 - uVar19)) >> auVar21;
              auVar26._0_4_ = (int)(iVar28 + (iVar25 - uVar19)) >> auVar21;
              auVar26._4_4_ = (int)(iVar33 + (iVar25 - uVar19)) >> auVar21;
              auVar26._8_4_ = (int)(iVar34 + (iVar25 - uVar19)) >> auVar21;
              auVar26._12_4_ = (int)(iVar35 + (iVar25 - uVar19)) >> auVar21;
              auVar26 = packusdw(auVar42,auVar26);
              sVar27 = auVar26._0_2_;
              in_XMM9._0_2_ = (ushort)(sVar3 < sVar27) * sVar3 | (ushort)(sVar3 >= sVar27) * sVar27;
              sVar27 = auVar26._2_2_;
              in_XMM9._2_2_ = (ushort)(sVar4 < sVar27) * sVar4 | (ushort)(sVar4 >= sVar27) * sVar27;
              sVar27 = auVar26._4_2_;
              in_XMM9._4_2_ = (ushort)(sVar3 < sVar27) * sVar3 | (ushort)(sVar3 >= sVar27) * sVar27;
              sVar27 = auVar26._6_2_;
              in_XMM9._6_2_ = (ushort)(sVar4 < sVar27) * sVar4 | (ushort)(sVar4 >= sVar27) * sVar27;
              sVar27 = auVar26._8_2_;
              in_XMM9._8_2_ = (ushort)(sVar3 < sVar27) * sVar3 | (ushort)(sVar3 >= sVar27) * sVar27;
              sVar27 = auVar26._10_2_;
              in_XMM9._10_2_ = (ushort)(sVar4 < sVar27) * sVar4 | (ushort)(sVar4 >= sVar27) * sVar27
              ;
              sVar27 = auVar26._12_2_;
              sVar36 = auVar26._14_2_;
              in_XMM9._12_2_ = (ushort)(sVar3 < sVar27) * sVar3 | (ushort)(sVar3 >= sVar27) * sVar27
              ;
              in_XMM9._14_2_ = (ushort)(sVar4 < sVar36) * sVar4 | (ushort)(sVar4 >= sVar36) * sVar36
              ;
              puVar9 = dst0 + uVar8 * (long)dst_stride0;
            }
            *(undefined1 (*) [16])(puVar9 + lVar12) = in_XMM9;
            lVar12 = lVar12 + 8;
          } while (lVar12 < w);
        }
        uVar8 = uVar8 + 1;
        puVar20 = puVar20 + lVar11;
        src = src + src_stride;
      } while (uVar8 != (uint)h);
    }
  }
  else if (0 < h && (w & 3U) == 0) {
    lVar12 = (long)src_stride;
    puVar20 = src + lVar12;
    uVar8 = 0;
    puVar9 = puVar2;
    puVar18 = puVar2 + lVar11;
    do {
      if (0 < w) {
        lVar14 = 0;
        do {
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)(puVar20 + lVar14);
          auVar38._8_8_ = *(ulong *)(puVar20 + lVar14);
          auVar38._0_8_ = *(undefined8 *)(src + lVar14);
          auVar26 = psllw(auVar38,auVar21);
          if (iVar6 == 0) {
            auVar40 = paddusw(auVar26,auVar24);
            puVar13 = puVar2;
            puVar17 = puVar2 + lVar11;
            lVar15 = lVar11;
          }
          else {
            in_XMM11 = pmovzxwd(in_XMM11,*(undefined8 *)(puVar9 + lVar14));
            in_XMM10 = pmovzxwd(in_XMM10,*(undefined8 *)(puVar18 + lVar14));
            auVar30 = pmovzxwd(auVar29,auVar26);
            auVar31._0_4_ = auVar30._0_4_ + uVar19;
            auVar31._4_4_ = auVar30._4_4_ + uVar19;
            auVar31._8_4_ = auVar30._8_4_ + uVar19;
            auVar31._12_4_ = auVar30._12_4_ + uVar19;
            auVar39._0_4_ = auVar26._8_2_ + uVar19;
            auVar39._4_4_ = auVar26._10_2_ + uVar19;
            auVar39._8_4_ = auVar26._12_2_ + uVar19;
            auVar39._12_4_ = auVar26._14_2_ + uVar19;
            if (iVar1 == 0) {
              iVar28 = auVar31._0_4_ + in_XMM11._0_4_ >> 1;
              iVar33 = auVar31._4_4_ + in_XMM11._4_4_ >> 1;
              iVar34 = auVar31._8_4_ + in_XMM11._8_4_ >> 1;
              iVar35 = auVar31._12_4_ + in_XMM11._12_4_ >> 1;
              iVar37 = auVar39._0_4_ + in_XMM10._0_4_ >> 1;
              iVar44 = auVar39._4_4_ + in_XMM10._4_4_ >> 1;
              iVar45 = auVar39._8_4_ + in_XMM10._8_4_ >> 1;
              iVar46 = auVar39._12_4_ + in_XMM10._12_4_ >> 1;
            }
            else {
              in_XMM11 = pmulld(in_XMM11,auVar22);
              auVar26 = pmulld(auVar31,auVar23);
              iVar28 = auVar26._0_4_ + in_XMM11._0_4_ >> 4;
              iVar33 = auVar26._4_4_ + in_XMM11._4_4_ >> 4;
              iVar34 = auVar26._8_4_ + in_XMM11._8_4_ >> 4;
              iVar35 = auVar26._12_4_ + in_XMM11._12_4_ >> 4;
              in_XMM10 = pmulld(in_XMM10,auVar22);
              auVar26 = pmulld(auVar39,auVar23);
              iVar37 = auVar26._0_4_ + in_XMM10._0_4_ >> 4;
              iVar44 = auVar26._4_4_ + in_XMM10._4_4_ >> 4;
              iVar45 = auVar26._8_4_ + in_XMM10._8_4_ >> 4;
              iVar46 = auVar26._12_4_ + in_XMM10._12_4_ >> 4;
            }
            auVar32._0_4_ = (int)(iVar28 + (iVar25 - uVar19)) >> auVar21;
            auVar32._4_4_ = (int)(iVar33 + (iVar25 - uVar19)) >> auVar21;
            auVar32._8_4_ = (int)(iVar34 + (iVar25 - uVar19)) >> auVar21;
            auVar32._12_4_ = (int)(iVar35 + (iVar25 - uVar19)) >> auVar21;
            auVar41._0_4_ = (int)(iVar37 + (iVar25 - uVar19)) >> auVar21;
            auVar41._4_4_ = (int)(iVar44 + (iVar25 - uVar19)) >> auVar21;
            auVar41._8_4_ = (int)(iVar45 + (iVar25 - uVar19)) >> auVar21;
            auVar41._12_4_ = (int)(iVar46 + (iVar25 - uVar19)) >> auVar21;
            auVar26 = packusdw(auVar32,auVar41);
            sVar27 = auVar26._0_2_;
            auVar40._0_2_ = (ushort)(sVar3 < sVar27) * sVar3 | (ushort)(sVar3 >= sVar27) * sVar27;
            sVar27 = auVar26._2_2_;
            auVar40._2_2_ = (ushort)(sVar4 < sVar27) * sVar4 | (ushort)(sVar4 >= sVar27) * sVar27;
            sVar27 = auVar26._4_2_;
            auVar40._4_2_ = (ushort)(sVar3 < sVar27) * sVar3 | (ushort)(sVar3 >= sVar27) * sVar27;
            sVar27 = auVar26._6_2_;
            auVar40._6_2_ = (ushort)(sVar4 < sVar27) * sVar4 | (ushort)(sVar4 >= sVar27) * sVar27;
            sVar27 = auVar26._8_2_;
            auVar40._8_2_ = (ushort)(sVar3 < sVar27) * sVar3 | (ushort)(sVar3 >= sVar27) * sVar27;
            sVar27 = auVar26._10_2_;
            auVar40._10_2_ = (ushort)(sVar4 < sVar27) * sVar4 | (ushort)(sVar4 >= sVar27) * sVar27;
            sVar27 = auVar26._12_2_;
            sVar36 = auVar26._14_2_;
            auVar40._12_2_ = (ushort)(sVar3 < sVar27) * sVar3 | (ushort)(sVar3 >= sVar27) * sVar27;
            auVar40._14_2_ = (ushort)(sVar4 < sVar36) * sVar4 | (ushort)(sVar4 >= sVar36) * sVar36;
            puVar13 = dst0;
            puVar17 = dst0 + dst_stride0;
            lVar15 = (long)dst_stride0;
          }
          lVar15 = uVar8 * lVar15 + lVar14;
          *(long *)(puVar13 + lVar15) = auVar40._0_8_;
          *(long *)(puVar17 + lVar15) = auVar40._8_8_;
          lVar14 = lVar14 + 4;
        } while (lVar14 < w);
      }
      uVar8 = uVar8 + 2;
      puVar18 = puVar18 + lVar11 * 2;
      puVar9 = puVar9 + lVar11 * 2;
      puVar20 = puVar20 + lVar12 * 2;
      src = src + lVar12 * 2;
    } while (uVar8 < (uint)h);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_copy_sse4_1(const uint16_t *src,
                                                 int src_stride, uint16_t *dst0,
                                                 int dst_stride0, int w, int h,
                                                 ConvolveParams *conv_params,
                                                 int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;

  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);
  const __m128i zero = _mm_setzero_si128();
  int i, j;

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const __m128i offset_const_16b = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits <= 4);

  if (!(w % 8)) {
    for (i = 0; i < h; i += 1) {
      for (j = 0; j < w; j += 8) {
        const __m128i src_16bit =
            _mm_loadu_si128((__m128i *)(&src[i * src_stride + j]));
        const __m128i res = _mm_sll_epi16(src_16bit, left_shift);
        if (do_average) {
          const __m128i data_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i data_ref_0_lo = _mm_unpacklo_epi16(data_0, zero);
          const __m128i data_ref_0_hi = _mm_unpackhi_epi16(data_0, zero);

          const __m128i res_32b_lo = _mm_unpacklo_epi16(res, zero);
          const __m128i res_unsigned_lo =
              _mm_add_epi32(res_32b_lo, offset_const);

          const __m128i comp_avg_res_lo =
              highbd_comp_avg_sse4_1(&data_ref_0_lo, &res_unsigned_lo, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);

          const __m128i res_32b_hi = _mm_unpackhi_epi16(res, zero);
          const __m128i res_unsigned_hi =
              _mm_add_epi32(res_32b_hi, offset_const);

          const __m128i comp_avg_res_hi =
              highbd_comp_avg_sse4_1(&data_ref_0_hi, &res_unsigned_hi, &wt0,
                                     &wt1, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = highbd_convolve_rounding_sse2(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m128i round_result_hi = highbd_convolve_rounding_sse2(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b =
              _mm_packus_epi32(round_result_lo, round_result_hi);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

          _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          const __m128i res_unsigned_16b =
              _mm_adds_epu16(res, offset_const_16b);

          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]),
                          res_unsigned_16b);
        }
      }
    }
  } else if (!(w % 4)) {
    for (i = 0; i < h; i += 2) {
      for (j = 0; j < w; j += 4) {
        const __m128i src_row_0 =
            _mm_loadl_epi64((__m128i *)(&src[i * src_stride + j]));
        const __m128i src_row_1 =
            _mm_loadl_epi64((__m128i *)(&src[i * src_stride + j + src_stride]));
        const __m128i src_10 = _mm_unpacklo_epi64(src_row_0, src_row_1);

        const __m128i res = _mm_sll_epi16(src_10, left_shift);

        if (do_average) {
          const __m128i data_0 =
              _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
          const __m128i data_1 = _mm_loadl_epi64(
              (__m128i *)(&dst[i * dst_stride + j + dst_stride]));

          const __m128i data_ref_0 = _mm_unpacklo_epi16(data_0, zero);
          const __m128i data_ref_1 = _mm_unpacklo_epi16(data_1, zero);

          const __m128i res_32b = _mm_unpacklo_epi16(res, zero);
          const __m128i res_unsigned_lo = _mm_add_epi32(res_32b, offset_const);

          const __m128i res_32b_hi = _mm_unpackhi_epi16(res, zero);
          const __m128i res_unsigned_hi =
              _mm_add_epi32(res_32b_hi, offset_const);

          const __m128i comp_avg_res_lo = highbd_comp_avg_sse4_1(
              &data_ref_0, &res_unsigned_lo, &wt0, &wt1, use_dist_wtd_comp_avg);
          const __m128i comp_avg_res_hi = highbd_comp_avg_sse4_1(
              &data_ref_1, &res_unsigned_hi, &wt0, &wt1, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = highbd_convolve_rounding_sse2(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m128i round_result_hi = highbd_convolve_rounding_sse2(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_16b =
              _mm_packus_epi32(round_result_lo, round_result_hi);
          const __m128i res_clip = _mm_min_epi16(res_16b, clip_pixel_to_bd);

          const __m128i res_1 = _mm_srli_si128(res_clip, 8);

          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_clip);
          _mm_storel_epi64(
              (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
        } else {
          const __m128i res_unsigned_16b =
              _mm_adds_epu16(res, offset_const_16b);

          const __m128i res_1 = _mm_srli_si128(res_unsigned_16b, 8);

          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]),
                           res_unsigned_16b);
          _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                           res_1);
        }
      }
    }
  }
}